

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O2

SampledSpectrum __thiscall
pbrt::MLTIntegrator::L
          (MLTIntegrator *this,ScratchBuffer *scratchBuffer,MLTSampler *sampler,int depth,
          Point2f *pRaster,SampledWavelengths *lambda)

{
  Tuple2<pbrt::Point2,_float> TVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  int iVar4;
  Array path;
  CameraRayDifferential *pCVar5;
  Array path_00;
  Tuple2<pbrt::Point2,_float> *pTVar6;
  TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
  TVar7;
  uintptr_t iptr;
  int maxDepth;
  Float FVar8;
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined8 uVar17;
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined8 uVar22;
  undefined1 auVar19 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 in_register_00001284 [12];
  Bounds2f BVar24;
  SampledSpectrum SVar25;
  int local_17c;
  Float local_174;
  optional<pbrt::Point2<float>_> pRasterNew;
  SampledSpectrum L;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  ulong local_110;
  uintptr_t local_108;
  uintptr_t local_100;
  uintptr_t local_f8;
  TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  local_f0;
  SamplerHandle local_e8;
  TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  local_e0;
  SamplerHandle local_d8;
  CameraSample local_d0;
  optional<pbrt::CameraRayDifferential> crd;
  SampledSpectrum local_40;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 auVar18 [56];
  undefined1 auVar23 [56];
  
  uVar22 = in_ZMM1._12_8_;
  maxDepth = 0;
  MLTSampler::StartStream(sampler,0);
  if (depth == 0) {
    local_17c = 2;
    local_174 = 1.0;
  }
  else {
    FVar8 = MLTSampler::Get1D(sampler);
    local_174 = (Float)(depth + 2);
    maxDepth = depth + 1;
    if ((int)(FVar8 * local_174) <= depth + 1) {
      maxDepth = (int)(FVar8 * local_174);
    }
    local_17c = (depth + 2) - maxDepth;
  }
  if (*(char *)(Options + 0xd) == '\x01') {
    local_d0.pFilm.super_Tuple2<pbrt::Point2,_float> =
         *(Tuple2<pbrt::Point2,_float> *)
          (((this->camera).
            super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
            .bits & 0xffffffffffff) + 0x340);
    FilmHandle::SampleWavelengths((SampledWavelengths *)&crd,(FilmHandle *)&local_d0,0.5);
    uVar17 = crd.optionalValue._8_8_;
  }
  else {
    local_d0.pFilm.super_Tuple2<pbrt::Point2,_float> =
         *(Tuple2<pbrt::Point2,_float> *)
          (((this->camera).
            super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
            .bits & 0xffffffffffff) + 0x340);
    FVar8 = MLTSampler::Get1D(sampler);
    FilmHandle::SampleWavelengths((SampledWavelengths *)&crd,(FilmHandle *)&local_d0,FVar8);
    uVar17 = crd.optionalValue._8_8_;
  }
  *(undefined8 *)(lambda->lambda).values = crd.optionalValue.__align;
  *(undefined8 *)((lambda->lambda).values + 2) = uVar17;
  *(undefined8 *)(lambda->pdf).values = crd.optionalValue._16_8_;
  *(undefined8 *)((lambda->pdf).values + 2) = crd.optionalValue._24_8_;
  path = ScratchBuffer::Alloc<pbrt::Vertex[]>(scratchBuffer,(long)local_17c);
  crd.optionalValue.__align =
       *(anon_struct_8_0_00000001_for___align *)
        (((this->camera).
          super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
          .bits & 0xffffffffffff) + 0x340);
  BVar24 = TaggedPointer<pbrt::RGBFilm,pbrt::GBufferFilm>::
           Dispatch<pbrt::FilmHandle::SampleBounds()const::_lambda(auto:1)_1_>();
  auVar13._0_8_ = MLTSampler::Get2D(sampler);
  auVar13._8_56_ = extraout_var;
  auVar19._8_4_ = 0x3f800000;
  auVar19._0_8_ = 0x3f8000003f800000;
  auVar19._12_4_ = 0x3f800000;
  auVar19 = vsubps_avx(auVar19,auVar13._0_16_);
  local_128 = BVar24.pMax.super_Tuple2<pbrt::Point2,_float>.x;
  fStack_124 = BVar24.pMax.super_Tuple2<pbrt::Point2,_float>.y;
  fStack_120 = (float)uVar22;
  fStack_11c = (float)((ulong)uVar22 >> 0x20);
  auVar10._0_4_ = auVar13._0_4_ * local_128;
  auVar10._4_4_ = auVar13._4_4_ * fStack_124;
  auVar10._8_4_ = extraout_var._0_4_ * fStack_120;
  auVar10._12_4_ = extraout_var._4_4_ * fStack_11c;
  auVar2._8_8_ = uVar17;
  auVar2._0_4_ = BVar24.pMin.super_Tuple2<pbrt::Point2,_float>.x;
  auVar2._4_4_ = BVar24.pMin.super_Tuple2<pbrt::Point2,_float>.y;
  auVar19 = vfmadd231ps_fma(auVar10,auVar19,auVar2);
  TVar1 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar19);
  pRaster->super_Tuple2<pbrt::Point2,_float> = TVar1;
  local_d0.weight = 1.0;
  local_d0.pFilm.super_Tuple2<pbrt::Point2,_float> =
       (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar19);
  local_d0.time = MLTSampler::Get1D(sampler);
  auVar14._0_8_ = MLTSampler::Get2D(sampler);
  auVar14._8_56_ = extraout_var_00;
  local_d0.pLens.super_Tuple2<pbrt::Point2,_float> =
       (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar14._0_16_);
  CameraHandle::GenerateRayDifferential(&crd,&this->camera,&local_d0,lambda);
  if (crd.set == true) {
    pCVar5 = pstd::optional<pbrt::CameraRayDifferential>::value(&crd);
    bVar3 = SampledSpectrum::operator_cast_to_bool(&pCVar5->weight);
    if (bVar3) {
      auVar11._0_4_ = (float)sampler->mutationsPerPixel;
      auVar11._4_12_ = in_register_00001284;
      auVar23 = ZEXT856(0);
      if (auVar11._0_4_ < 0.0) {
        auVar23 = ZEXT856(0);
        fVar9 = sqrtf(auVar11._0_4_);
      }
      else {
        auVar19 = vsqrtss_avx(auVar11,auVar11);
        fVar9 = auVar19._0_4_;
      }
      pCVar5 = pstd::optional<pbrt::CameraRayDifferential>::value(&crd);
      auVar12._0_4_ = 1.0 / fVar9;
      auVar12._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar19 = vmaxss_avx(auVar12,ZEXT416(0x3e000000));
      RayDifferential::ScaleDifferentials(&pCVar5->ray,auVar19._0_4_);
      pCVar5 = pstd::optional<pbrt::CameraRayDifferential>::value(&crd);
      TVar7.bits = (ulong)sampler | 0x7000000000000;
      local_e0.bits =
           (this->camera).
           super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
           .bits;
      local_d8.
      super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
      .bits = (TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
               )(TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                 )TVar7.bits;
      iVar4 = GenerateCameraSubpath
                        (&this->super_Integrator,&pCVar5->ray,lambda,&local_d8,scratchBuffer,
                         local_17c,(CameraHandle *)&local_e0,path,this->regularize);
      if (iVar4 == local_17c) {
        MLTSampler::StartStream(sampler,1);
        path_00 = ScratchBuffer::Alloc<pbrt::Vertex[]>(scratchBuffer,(long)maxDepth);
        local_f0.bits =
             (this->camera).
             super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
             .bits;
        local_f8 = (this->lightSampler).
                   super_TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
                   .bits;
        auVar18 = (undefined1  [56])0x0;
        local_e8.
        super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
        .bits = (TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                 )(TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                   )TVar7.bits;
        iVar4 = GenerateLightSubpath
                          (&this->super_Integrator,lambda,&local_e8,(CameraHandle *)&local_f0,
                           scratchBuffer,maxDepth,(path->field_2).ei.super_Interaction.time,
                           (LightSamplerHandle)&local_f8,path_00,this->regularize);
        if (iVar4 == maxDepth) {
          MLTSampler::StartStream(sampler,2);
          pRasterNew.set = false;
          local_100 = (this->lightSampler).
                      super_TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
                      .bits;
          local_108 = (this->camera).
                      super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                      .bits;
          local_110 = TVar7.bits;
          SVar25 = ConnectBDPT(&this->super_Integrator,lambda,path_00,path,maxDepth,local_17c,
                               (LightSamplerHandle)&local_100,(CameraHandle)&local_108,
                               (SamplerHandle)&local_110,&pRasterNew,(Float *)0x0);
          auVar20._0_8_ = SVar25.values.values._8_8_;
          auVar20._8_56_ = auVar23;
          auVar15._0_8_ = SVar25.values.values._0_8_;
          auVar15._8_56_ = auVar18;
          local_40.values.values = (array<float,_4>)vmovlhps_avx(auVar15._0_16_,auVar20._0_16_);
          auVar18 = (undefined1  [56])0x0;
          SVar25 = SampledSpectrum::operator*(&local_40,local_174);
          auVar21._0_8_ = SVar25.values.values._8_8_;
          auVar21._8_56_ = auVar23;
          auVar16._0_8_ = SVar25.values.values._0_8_;
          auVar16._8_56_ = auVar18;
          L.values.values = (array<float,_4>)vmovlhps_avx(auVar16._0_16_,auVar21._0_16_);
          if (pRasterNew.set == true) {
            pTVar6 = &pstd::optional<pbrt::Point2<float>_>::value(&pRasterNew)->
                      super_Tuple2<pbrt::Point2,_float>;
            pRaster->super_Tuple2<pbrt::Point2,_float> = *pTVar6;
          }
          pstd::optional<pbrt::Point2<float>_>::~optional(&pRasterNew);
        }
        else {
          SampledSpectrum::SampledSpectrum(&L,0.0);
        }
      }
      else {
        SampledSpectrum::SampledSpectrum(&L,0.0);
      }
      goto LAB_0043d26a;
    }
  }
  SampledSpectrum::SampledSpectrum(&L,0.0);
LAB_0043d26a:
  pstd::optional<pbrt::CameraRayDifferential>::~optional(&crd);
  return (SampledSpectrum)L.values;
}

Assistant:

SampledSpectrum MLTIntegrator::L(ScratchBuffer &scratchBuffer, MLTSampler &sampler,
                                 int depth, Point2f *pRaster,
                                 SampledWavelengths *lambda) {
    sampler.StartStream(cameraStreamIndex);
    // Determine the number of available strategies and pick a specific one
    int s, t, nStrategies;
    if (depth == 0) {
        nStrategies = 1;
        s = 0;
        t = 2;
    } else {
        nStrategies = depth + 2;
        s = std::min<int>(sampler.Get1D() * nStrategies, nStrategies - 1);
        t = nStrategies - s;
    }

    // Sample wavelengths for MLT path
    if (Options->disableWavelengthJitter)
        *lambda = camera.GetFilm().SampleWavelengths(0.5);
    else
        *lambda = camera.GetFilm().SampleWavelengths(sampler.Get1D());

    // Generate a camera subpath with exactly _t_ vertices
    Vertex *cameraVertices = scratchBuffer.Alloc<Vertex[]>(t);
    Bounds2f sampleBounds = camera.GetFilm().SampleBounds();
    *pRaster = sampleBounds.Lerp(sampler.Get2D());
    CameraSample cameraSample;
    cameraSample.pFilm = *pRaster;
    cameraSample.time = sampler.Get1D();
    cameraSample.pLens = sampler.Get2D();
    pstd::optional<CameraRayDifferential> crd =
        camera.GenerateRayDifferential(cameraSample, *lambda);
    if (!crd || !crd->weight)
        return SampledSpectrum(0.f);
    Float rayDiffScale =
        std::max<Float>(.125, 1 / std::sqrt((Float)sampler.SamplesPerPixel()));
    crd->ray.ScaleDifferentials(rayDiffScale);

    if (GenerateCameraSubpath(*this, crd->ray, *lambda, &sampler, scratchBuffer, t,
                              camera, cameraVertices, regularize) != t)
        return SampledSpectrum(0.f);

    // Generate a light subpath with exactly _s_ vertices
    sampler.StartStream(lightStreamIndex);
    Vertex *lightVertices = scratchBuffer.Alloc<Vertex[]>(s);
    if (GenerateLightSubpath(*this, *lambda, &sampler, camera, scratchBuffer, s,
                             cameraVertices[0].time(), lightSampler, lightVertices,
                             regularize) != s)
        return SampledSpectrum(0.f);

    // Execute connection strategy and return the radiance estimate
    sampler.StartStream(connectionStreamIndex);
    pstd::optional<Point2f> pRasterNew;
    SampledSpectrum L = ConnectBDPT(*this, *lambda, lightVertices, cameraVertices, s, t,
                                    lightSampler, camera, &sampler, &pRasterNew) *
                        nStrategies;
    if (pRasterNew.has_value())
        *pRaster = *pRasterNew;
    return L;
}